

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O2

void __thiscall JsonTest::Runner::listTests(Runner *this)

{
  size_type sVar1;
  uint index;
  uint index_00;
  string local_40;
  
  sVar1 = std::deque<JsonTest::TestCase_*(*)(),_std::allocator<JsonTest::TestCase_*(*)()>_>::size
                    (&this->tests_);
  for (index_00 = 0; (uint)sVar1 != index_00; index_00 = index_00 + 1) {
    testNameAt_abi_cxx11_(&local_40,this,index_00);
    puts(local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void Runner::listTests() const {
  unsigned int count = testCount();
  for (unsigned int index = 0; index < count; ++index) {
    printf("%s\n", testNameAt(index).c_str());
  }
}